

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int in_permitted_area_end_bit(tgestate_t *state,uint8_t room_and_flags)

{
  byte in_SIL;
  long in_RDI;
  room_t room;
  undefined4 local_4;
  
  if ((in_SIL & 0x80) == 0) {
    if (*(byte *)(in_RDI + 0x120) == 0) {
      local_4 = within_camp_bounds(in_SIL,(mappos8_t *)(in_RDI + 0x68e));
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = (uint)(*(byte *)(in_RDI + 0x120) == (in_SIL & 0x7f));
  }
  return local_4;
}

Assistant:

int in_permitted_area_end_bit(tgestate_t *state, uint8_t room_and_flags)
{
  room_t room; /* was HL */

  assert(state != NULL);

  room = state->room_index; /* Conv: Dereferenced up-front once. */

  if (room_and_flags & permitted_route_ROOM)
  {
    /* Hero should be in the specified room. */
    ASSERT_ROOM_VALID(room_and_flags & ~permitted_route_ROOM);
    return room == (room_and_flags & ~permitted_route_ROOM);
  }
  else if (room == room_0_OUTDOORS) // is outside
  {
    /* Hero is outdoors - check bounds. */
    return within_camp_bounds(room_and_flags, &state->hero_mappos);
  }
  else
  {
    /* Hero should be outside but is in room - not permitted. */
    return 0;
  }
}